

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

holder<cs_impl::path_cs_ext::path_info> * __thiscall
cs::
allocator_type<cs_impl::any::holder<cs_impl::path_cs_ext::path_info>,64ul,cs_impl::default_allocator_provider>
::alloc<char(&)[256],unsigned_char&>
          (allocator_type<cs_impl::any::holder<cs_impl::path_cs_ext::path_info>,_64UL,_cs_impl::default_allocator_provider>
           *this,char (*args) [256],uchar *args_1)

{
  long lVar1;
  __int_type _Var2;
  holder<cs_impl::path_cs_ext::path_info> *__args;
  holder<cs_impl::path_cs_ext::path_info> *in_RDX;
  new_allocator<cs_impl::any::holder<cs_impl::path_cs_ext::path_info>_> *in_RSI;
  uchar *in_RDI;
  holder<cs_impl::path_cs_ext::path_info> *ptr;
  void *pvVar3;
  
  pvVar3 = (void *)0x0;
  if (*(long *)(in_RDI + 0x208) != 0) {
    _Var2 = std::__atomic_base::operator_cast_to_unsigned_long
                      ((__atomic_base<unsigned_long> *)in_RDX);
    if (_Var2 == 0) {
      lVar1 = *(long *)(in_RDI + 0x208);
      *(long *)(in_RDI + 0x208) = lVar1 + -1;
      __args = *(holder<cs_impl::path_cs_ext::path_info> **)(in_RDI + lVar1 * 8 + -8);
      goto LAB_004e5944;
    }
  }
  __args = __gnu_cxx::new_allocator<cs_impl::any::holder<cs_impl::path_cs_ext::path_info>_>::
           allocate(in_RSI,(size_type)in_RDX,pvVar3);
LAB_004e5944:
  __gnu_cxx::new_allocator<cs_impl::any::holder<cs_impl::path_cs_ext::path_info>>::
  construct<cs_impl::any::holder<cs_impl::path_cs_ext::path_info>,char(&)[256],unsigned_char&>
            (in_RSI,in_RDX,(char (*) [256])__args,in_RDI);
  return __args;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}